

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O1

uint16_t * getMissingLeavesList(uint16_t *challengeC,picnic_instance_t *params)

{
  byte bVar1;
  ulong uVar2;
  uint16_t *puVar3;
  uint16_t uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar8 = (ulong)params->num_rounds;
  bVar1 = params->num_opened_rounds;
  uVar9 = (ulong)bVar1;
  puVar3 = (uint16_t *)calloc(uVar8 - uVar9,2);
  if (uVar8 != 0) {
    uVar5 = 0;
    lVar6 = 0;
    do {
      uVar4 = (uint16_t)uVar5;
      bVar10 = uVar9 != 0;
      if ((bVar1 != 0) && (*challengeC != uVar4)) {
        uVar2 = 1;
        do {
          uVar7 = uVar2;
          if (uVar9 == uVar7) break;
          uVar2 = uVar7 + 1;
        } while (challengeC[uVar7] != uVar4);
        bVar10 = uVar7 < uVar9;
      }
      if (!bVar10) {
        puVar3[lVar6] = uVar4;
        lVar6 = lVar6 + 1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar8);
  }
  return puVar3;
}

Assistant:

static uint16_t* getMissingLeavesList(uint16_t* challengeC, const picnic_instance_t* params) {
  size_t missingLeavesSize = params->num_rounds - params->num_opened_rounds;
  uint16_t* missingLeaves  = calloc(missingLeavesSize, sizeof(uint16_t));
  size_t pos               = 0;

  for (size_t i = 0; i < params->num_rounds; i++) {
    if (!contains(challengeC, params->num_opened_rounds, i)) {
      missingLeaves[pos] = i;
      pos++;
    }
  }

  return missingLeaves;
}